

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,AssertPropertyStmt *stmt)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  PropertyAction PVar3;
  Property *pPVar4;
  Sequence *this_00;
  ostream *poVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view sVar6;
  basic_string_view<char> bVar7;
  string_view format_str;
  format_args args;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  undefined8 local_a8 [2];
  undefined1 auStack_98 [8];
  EventControl edge;
  undefined1 local_50 [8];
  string action;
  
  pPVar4 = stmt->property_;
  puVar1 = &(this->stream_).super_stringstream.field_0x10;
  sVar6 = indent(this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,sVar6._M_str,sVar6._M_len);
  poVar5 = std::operator<<(poVar5,"property ");
  poVar5 = std::operator<<(poVar5,(string *)pPVar4);
  poVar5 = std::operator<<(poVar5,";");
  puVar2 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar2 = *(long *)puVar2 + 1;
  std::operator<<(poVar5,'\n');
  this->indent_ = this->indent_ + 1;
  auStack_98 = (undefined1  [8])(pPVar4->edge_).delay;
  edge.delay = (uint64_t)(pPVar4->edge_).var;
  edge.var = *(Var **)&(pPVar4->edge_).type;
  edge.type = (pPVar4->edge_).delay_side;
  edge.edge = *(EventEdgeType *)&(pPVar4->edge_).field_0x1c;
  this_00 = (pPVar4->sequence_).super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if ((Var *)edge.delay != (Var *)0x0) {
    sVar6 = indent(this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,sVar6._M_str,sVar6._M_len);
    local_c8._8_8_ = 0;
    local_b0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/codegen.cc:738:67)>
               ::_M_invoke;
    local_b8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/codegen.cc:738:67)>
               ::_M_manager;
    local_c8._M_unused._M_object = this;
    EventControl::to_string
              ((string *)&edge.delay_side,(EventControl *)auStack_98,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
                *)&local_c8);
    local_a8[0]._0_4_ = edge.delay_side;
    local_a8[0]._4_4_ = edge._28_4_;
    bVar7 = fmt::v7::to_string_view<char,_0>("@({0}) ");
    format_str.data_ = (char *)bVar7.size_;
    format_str.size_ = 0xd;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_a8;
    fmt::v7::detail::vformat_abi_cxx11_((string *)local_50,(detail *)bVar7.data_,format_str,args);
    std::operator<<(poVar5,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    std::__cxx11::string::~string((string *)&edge.delay_side);
    std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  }
  edge._24_8_ = this;
  Sequence::to_string((string *)local_50,this_00,
                      (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(kratos::Var_*)>
                       *)&edge.delay_side);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)local_50);
  poVar5 = std::operator<<(poVar5,";");
  puVar2 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar2 = *(long *)puVar2 + 1;
  std::operator<<(poVar5,'\n');
  std::__cxx11::string::~string((string *)local_50);
  std::_Function_base::~_Function_base((_Function_base *)&edge.delay_side);
  this->indent_ = this->indent_ - 1;
  sVar6 = indent(this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,sVar6._M_str,sVar6._M_len);
  poVar5 = std::operator<<(poVar5,"endproperty");
  puVar2 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar2 = *(long *)puVar2 + 1;
  std::operator<<(poVar5,'\n');
  local_50 = (undefined1  [8])&action._M_string_length;
  action._M_dataplus._M_p = (pointer)0x0;
  action._M_string_length._0_1_ = 0;
  PVar3 = pPVar4->action_;
  if (((PVar3 == Assert) || (PVar3 == Assume)) || (PVar3 == Cover)) {
    std::__cxx11::string::assign(local_50);
    sVar6 = indent(this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,sVar6._M_str,sVar6._M_len);
    poVar5 = std::operator<<(poVar5,(string *)local_50);
    poVar5 = std::operator<<(poVar5," property (");
    poVar5 = std::operator<<(poVar5,(string *)pPVar4);
    std::operator<<(poVar5,")");
    if ((stmt->else_stmt_).super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 || PVar3 != Assert) {
      poVar5 = std::operator<<((ostream *)puVar1,';');
      puVar1 = &(this->stream_).super_stringstream.field_0x90;
      *(long *)puVar1 = *(long *)puVar1 + 1;
      std::operator<<(poVar5,'\n');
    }
    else {
      (**this->_vptr_SystemVerilogCodeGen)(this);
    }
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(AssertPropertyStmt* stmt) {
    auto* property = stmt->property();
    stream_ << indent() << "property " << property->property_name() << ";" << stream_.endl();
    increase_indent();
    auto edge = property->edge();
    auto* seq = property->sequence();
    if (edge.var) {
        stream_ << indent() << ::format("@({0}) ", edge.to_string([this](const Var* var) {
            return stream_.var_str(var);
        }));
    }
    stream_ << seq->to_string([this](Var* v) { return stream_.var_str(v); }) << ";"
            << stream_.endl();
    decrease_indent();
    stream_ << indent() << "endproperty" << stream_.endl();

    // put assert here
    std::string action;
    auto const action_type = property->action();
    if (action_type == PropertyAction::Assert)
        action = "assert";
    else if (action_type == PropertyAction::Assume)
        action = "assume";
    else if (action_type == PropertyAction::Cover)
        action = "cover";
    else
        return;
    stream_ << indent() << action << " property (" << property->property_name() << ")";
    if (stmt->else_() && action_type == PropertyAction::Assert) {
        dispatch_node(stmt->else_().get());
    } else {
        stream_ << ';' << stream_.endl();
    }
}